

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void duckdb_je_jemalloc_postfork_child(void)

{
  tsd_t *tsd;
  ulong uVar1;
  ulong uVar2;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_02493488);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  duckdb_je_tsd_postfork_child(tsd);
  duckdb_je_witness_postfork_child
            (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd);
  duckdb_je_stats_postfork_child((tsdn_t *)tsd);
  uVar1 = (ulong)narenas_total.repr;
  if (narenas_total.repr != 0) {
    uVar2 = 0;
    do {
      if ((arena_t *)duckdb_je_arenas[uVar2].repr != (arena_t *)0x0) {
        duckdb_je_arena_postfork_child((tsdn_t *)tsd,(arena_t *)duckdb_je_arenas[uVar2].repr);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  duckdb_je_prof_postfork_child((tsdn_t *)tsd);
  duckdb_je_background_thread_postfork_child((tsdn_t *)tsd);
  duckdb_je_malloc_mutex_postfork_child((tsdn_t *)tsd,&duckdb_je_arenas_lock);
  duckdb_je_tcache_postfork_child((tsdn_t *)tsd);
  duckdb_je_ctl_postfork_child((tsdn_t *)tsd);
  return;
}

Assistant:

void
jemalloc_postfork_child(void) {
	tsd_t *tsd;
	unsigned i, narenas;

	assert(malloc_initialized());

	tsd = tsd_fetch();

	tsd_postfork_child(tsd);

	witness_postfork_child(tsd_witness_tsdp_get(tsd));
	/* Release all mutexes, now that fork() has completed. */
	stats_postfork_child(tsd_tsdn(tsd));
	for (i = 0, narenas = narenas_total_get(); i < narenas; i++) {
		arena_t *arena;

		if ((arena = arena_get(tsd_tsdn(tsd), i, false)) != NULL) {
			arena_postfork_child(tsd_tsdn(tsd), arena);
		}
	}
	prof_postfork_child(tsd_tsdn(tsd));
	if (have_background_thread) {
		background_thread_postfork_child(tsd_tsdn(tsd));
	}
	malloc_mutex_postfork_child(tsd_tsdn(tsd), &arenas_lock);
	tcache_postfork_child(tsd_tsdn(tsd));
	ctl_postfork_child(tsd_tsdn(tsd));
}